

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2cTestPackage.cpp
# Opt level: O1

int __thiscall es2cts::TestCaseWrapper::init(TestCaseWrapper *this,EVP_PKEY_CTX *ctx)

{
  PackageContext *pPVar1;
  int iVar2;
  
  pPVar1 = (this->m_testPackage->super_TestPackage).m_packageCtx;
  glu::resetState((pPVar1->m_context).m_renderCtx,(pPVar1->m_context).m_contextInfo);
  iVar2 = (**(code **)(*(long *)ctx + 0x10))(ctx);
  return iVar2;
}

Assistant:

void TestCaseWrapper::init(tcu::TestCase* testCase, const std::string&)
{
	glu::resetState(m_testPackage.getContext().getRenderContext(), m_testPackage.getContext().getContextInfo());

	testCase->init();
}